

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletload_tests.cpp
# Opt level: O0

SerializeData *
wallet::walletload_tests::MakeSerializeData<std::__cxx11::string,CPubKey>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,CPubKey *args_1)

{
  iterator this;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  in_RDX;
  SerializeData *in_RDI;
  long in_FS_OFFSET;
  DataStream s;
  DataStream *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  DataStream *in_stack_ffffffffffffff78;
  allocator_type *__a;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  in_stack_ffffffffffffffb0;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  __a = (allocator_type *)&local_28;
  DataStream::DataStream(in_stack_ffffffffffffff68);
  SerializeMany<DataStream,std::__cxx11::string,CPubKey>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (CPubKey *)in_stack_ffffffffffffff68);
  DataStream::begin(in_stack_ffffffffffffff78);
  this = DataStream::end((DataStream *)in_stack_ffffffffffffff70);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::
  vector<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,void>
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)this._M_current,in_RDX,
             in_stack_ffffffffffffffb0,__a);
  DataStream::~DataStream(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

SerializeData MakeSerializeData(const Args&... args)
{
    DataStream s{};
    SerializeMany(s, args...);
    return {s.begin(), s.end()};
}